

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O0

void __thiscall OpenMD::PotVecAccumulator::PotVecAccumulator(PotVecAccumulator *this)

{
  BaseAccumulator *in_RDI;
  
  in_RDI->_vptr_BaseAccumulator = (_func_int **)0x0;
  in_RDI->Count_ = 0;
  BaseAccumulator::BaseAccumulator(in_RDI);
  in_RDI->_vptr_BaseAccumulator = (_func_int **)&PTR_clear_0050ac90;
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 1));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&in_RDI[4].Count_);
  Vector<double,_7U>::Vector((Vector<double,_7U> *)(in_RDI + 8));
  Vector<double,_7U>::Vector((Vector<double,_7U> *)&in_RDI[0xb].Count_);
  (**in_RDI->_vptr_BaseAccumulator)();
  return;
}

Assistant:

PotVecAccumulator() : BaseAccumulator() { this->clear(); }